

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt64(sysbvm_context_t *context,int64_t value)

{
  sysbvm_tuple_t local_60;
  sysbvm_tuple_t local_50;
  ulong local_40;
  sysbvm_integer_t *result_1;
  sysbvm_integer_t *result;
  uint64_t positiveValue;
  int64_t value_local;
  sysbvm_context_t *context_local;
  
  if ((value < -0x800000000000000) || (0x7ffffffffffffff < value)) {
    local_40 = value;
    if (value < 0) {
      local_40 = -value;
    }
    if (local_40 < 0x100000000) {
      if (value < 0) {
        local_50 = (context->roots).largeNegativeIntegerType;
      }
      else {
        local_50 = (context->roots).largePositiveIntegerType;
      }
      context_local = (sysbvm_context_t *)sysbvm_context_allocateByteTuple(context,local_50,4);
      *(int *)&(context_local->heap).shouldAttemptToCollect = (int)value;
    }
    else {
      if (value < 0) {
        local_60 = (context->roots).largeNegativeIntegerType;
      }
      else {
        local_60 = (context->roots).largePositiveIntegerType;
      }
      context_local = (sysbvm_context_t *)sysbvm_context_allocateByteTuple(context,local_60,8);
      ((anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
      &(context_local->heap).shouldAttemptToCollect)->pointers[0] = value;
    }
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_tuple_integer_encodeSmall(value);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_integer_encodeBigInt64(sysbvm_context_t *context, int64_t value)
{
    if(SYSBVM_IMMEDIATE_INT_MIN <= value && value <= SYSBVM_IMMEDIATE_INT_MAX)
        return sysbvm_tuple_integer_encodeSmall((sysbvm_stuple_t)value);

    uint64_t positiveValue = value >= 0 ? (uint64_t)value : (uint64_t)(-value);

    if(positiveValue <= UINT32_MAX)
    {
        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, value >= 0 ? context->roots.largePositiveIntegerType : context->roots.largeNegativeIntegerType, 4);
        result->words[0] = (uint32_t)value;
        return (sysbvm_tuple_t)result;
    }
    else
    {
        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, value >= 0 ? context->roots.largePositiveIntegerType : context->roots.largeNegativeIntegerType, 8);
        result->words[0] = (uint32_t)value;
        result->words[1] = (uint32_t)(value >> 32);
        return (sysbvm_tuple_t)result;
    }
}